

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

int luaG_getfuncline(Proto *f,int pc)

{
  long lVar1;
  AbsLineInfo *pAVar2;
  AbsLineInfo *pAVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int *piVar8;
  
  if (f->lineinfo == (ls_byte *)0x0) {
    iVar6 = -1;
  }
  else {
    iVar6 = f->sizeabslineinfo;
    if (((long)iVar6 == 0) || (pAVar3 = f->abslineinfo, pc < pAVar3->pc)) {
      piVar8 = &f->linedefined;
      lVar7 = -1;
    }
    else {
      iVar4 = pc / 0x80;
      iVar5 = iVar4;
      if (iVar4 < iVar6) {
        iVar5 = iVar6;
      }
      iVar5 = iVar5 + -1;
      lVar7 = (long)iVar4;
      do {
        if (iVar6 <= lVar7) goto LAB_001095d1;
        lVar1 = lVar7 + 1;
        pAVar2 = pAVar3 + lVar7;
        lVar7 = lVar1;
      } while (pAVar2->pc <= pc);
      iVar5 = (int)lVar1 + -2;
LAB_001095d1:
      piVar8 = &pAVar3[iVar5].line;
      lVar7 = (long)pAVar3[iVar5].pc;
    }
    iVar6 = *piVar8;
    for (; lVar7 < pc; lVar7 = lVar7 + 1) {
      iVar6 = iVar6 + f->lineinfo[lVar7 + 1];
    }
  }
  return iVar6;
}

Assistant:

int luaG_getfuncline (const Proto *f, int pc) {
  if (f->lineinfo == NULL)  /* no debug information? */
    return -1;
  else {
    int basepc;
    int baseline = getbaseline(f, pc, &basepc);
    while (basepc++ < pc) {  /* walk until given instruction */
      lua_assert(f->lineinfo[basepc] != ABSLINEINFO);
      baseline += f->lineinfo[basepc];  /* correct line */
    }
    return baseline;
  }
}